

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O0

Vec_Int_t * Gia_IsoCollectData(Gia_Man_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  Vec_Int_t *p_00;
  bool bVar2;
  Vec_Int_t *vData;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vObjs_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(vObjs);
  p_00 = Vec_IntAlloc(iVar1);
  vData._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjs);
    bVar2 = false;
    if (vData._4_4_ < iVar1) {
      iVar1 = Vec_IntEntry(vObjs,vData._4_4_);
      pGStack_20 = Gia_ManObj(p,iVar1);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    Vec_IntPush(p_00,pGStack_20->Value);
    vData._4_4_ = vData._4_4_ + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_IsoCollectData( Gia_Man_t * p, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj;  int i;
    Vec_Int_t * vData = Vec_IntAlloc( Vec_IntSize(vObjs) );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        Vec_IntPush( vData, pObj->Value );
    return vData;
}